

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

int uv_loop_alive(uv_loop_t *loop)

{
  if (((loop->active_handles == 0) && ((loop->active_reqs).count == 0)) &&
     ((loop->pending_queue).next == &loop->pending_queue)) {
    return (int)(loop->closing_handles != (uv_handle_t *)0x0);
  }
  return 1;
}

Assistant:

int uv_loop_alive(const uv_loop_t* loop) {
  return uv__loop_alive(loop);
}